

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

Type * __thiscall
soul::AST::EndpointDetails::getDataType
          (Type *__return_storage_ptr__,EndpointDetails *this,Expression *e)

{
  bool bVar1;
  int iVar2;
  pointer pTVar3;
  pointer other;
  vector<soul::Type,_std::allocator<soul::Type>_> local_68;
  EndpointDetails *local_50;
  Type local_48;
  
  local_50 = this;
  getSampleArrayTypes(&local_68,this);
  pTVar3 = local_68.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
           super__Vector_impl_data._M_finish;
  other = local_68.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
          super__Vector_impl_data._M_start;
  do {
    if (other == pTVar3) {
      std::vector<soul::Type,_std::allocator<soul::Type>_>::~vector(&local_68);
      getSampleArrayTypes(&local_68,local_50);
      pTVar3 = local_68.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
               super__Vector_impl_data._M_start;
      while( true ) {
        if (pTVar3 == local_68.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
          std::vector<soul::Type,_std::allocator<soul::Type>_>::~vector(&local_68);
          throwInternalCompilerError("getDataType",0x414);
        }
        iVar2 = (*(e->super_Statement).super_ASTObject._vptr_ASTObject[0x10])(e,pTVar3);
        if ((char)iVar2 != '\0') break;
        pTVar3 = pTVar3 + 1;
      }
      Type::Type(__return_storage_ptr__,pTVar3);
LAB_00248b96:
      std::vector<soul::Type,_std::allocator<soul::Type>_>::~vector(&local_68);
      return __return_storage_ptr__;
    }
    (*(e->super_Statement).super_ASTObject._vptr_ASTObject[4])(&local_48,e);
    bVar1 = Type::isEqual(&local_48,other,4);
    RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_48.structure);
    if (bVar1) {
      Type::Type(__return_storage_ptr__,other);
      goto LAB_00248b96;
    }
    other = other + 1;
  } while( true );
}

Assistant:

Type getDataType (Expression& e) const
        {
            for (auto& type : getSampleArrayTypes())
                if (e.getResultType().isEqual (type, Type::ignoreVectorSize1))
                    return type;

            for (auto& type : getSampleArrayTypes())
                if (e.canSilentlyCastTo (type))
                    return type;

            SOUL_ASSERT_FALSE;
            return {};
        }